

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v6::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *file;
  uint *message;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  
  iVar2 = lhs1->exp_;
  iVar10 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + iVar2;
  iVar3 = lhs2->exp_;
  iVar11 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + iVar3;
  iVar7 = iVar11;
  if (iVar11 < iVar10) {
    iVar7 = iVar10;
  }
  uVar14 = (uint)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = rhs->exp_;
  iVar1 = iVar4 + uVar14;
  if (iVar7 + 1 < iVar1) {
LAB_0010e2ea:
    iVar8 = -1;
  }
  else if (iVar1 < iVar7) {
LAB_0010e2f8:
    iVar8 = 1;
  }
  else {
    iVar7 = iVar2;
    if (iVar3 < iVar2) {
      iVar7 = iVar3;
    }
    if (iVar4 < iVar7) {
      iVar7 = iVar4;
    }
    iVar8 = 0;
    if (iVar7 < iVar1) {
      file = (lhs2->bigits_).super_buffer<unsigned_int>.ptr_;
      message = (rhs->bigits_).super_buffer<unsigned_int>.ptr_;
      uVar12 = 0;
      do {
        uVar14 = uVar14 - 1;
        iVar8 = iVar4 + uVar14 + 1;
        if (iVar10 < iVar8 || iVar8 <= iVar2) {
          uVar6 = 0;
        }
        else {
          uVar5 = (iVar4 - iVar2) + uVar14;
          if ((int)uVar5 < 0) goto LAB_0010e41e;
          uVar6 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[uVar5];
        }
        if (iVar11 < iVar8 || iVar8 <= iVar3) {
          uVar13 = 0;
        }
        else {
          uVar5 = (iVar4 - iVar3) + uVar14;
          if ((int)uVar5 < 0) goto LAB_0010e41e;
          uVar13 = (ulong)file[uVar5];
        }
        if (iVar1 < iVar8 || iVar8 <= iVar4) {
          uVar9 = 0;
        }
        else {
          if ((int)uVar14 < 0) {
LAB_0010e41e:
            assert_fail((char *)file,0,(char *)message);
          }
          uVar9 = (ulong)message[uVar14];
        }
        uVar9 = uVar9 | uVar12;
        uVar13 = uVar13 + uVar6;
        if (uVar9 < uVar13) goto LAB_0010e2f8;
        if (1 < uVar9 - uVar13) goto LAB_0010e2ea;
        uVar12 = uVar9 - uVar13 << 0x20;
      } while (iVar7 < (int)(iVar4 + uVar14));
      iVar8 = -(uint)(uVar9 != uVar13);
    }
  }
  return iVar8;
}

Assistant:

int num_bigits() const { return static_cast<int>(bigits_.size()) + exp_; }